

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pockle.c
# Opt level: O2

PockleStatus pockle_add_small_prime(Pockle *pockle,mp_int *p)

{
  ushort *puVar1;
  uint uVar2;
  uintmax_t uVar3;
  long lVar4;
  PockleStatus PVar5;
  
  uVar2 = mp_hs_integer(p,0x100000000);
  if (uVar2 == 0) {
    uVar3 = mp_get_integer(p);
    if ((uint)uVar3 < 2) {
      PVar5 = POCKLE_PRIME_SMALLER_THAN_2;
    }
    else {
      init_smallprimes();
      lVar4 = 0;
      PVar5 = POCKLE_SMALL_PRIME_NOT_PRIME;
      do {
        if ((lVar4 == 0x198e) || (puVar1 = smallprimes_array + lVar4, (uint)uVar3 == (uint)*puVar1))
        {
          pockle_insert(pockle,p,(mp_int **)0x0,0,(mp_int *)0x0);
          return POCKLE_OK;
        }
        lVar4 = lVar4 + 1;
      } while ((int)((uVar3 & 0xffffffff) % (ulong)(uint)*puVar1) != 0);
    }
  }
  else {
    PVar5 = POCKLE_SMALL_PRIME_NOT_SMALL;
  }
  return PVar5;
}

Assistant:

PockleStatus pockle_add_small_prime(Pockle *pockle, mp_int *p)
{
    if (mp_hs_integer(p, (1ULL << 32)))
        return POCKLE_SMALL_PRIME_NOT_SMALL;

    uint32_t val = mp_get_integer(p);

    if (val < 2)
        return POCKLE_PRIME_SMALLER_THAN_2;

    init_smallprimes();
    for (size_t i = 0; i < NSMALLPRIMES; i++) {
        if (val == smallprimes[i])
            break; /* success */
        if (val % smallprimes[i] == 0)
            return POCKLE_SMALL_PRIME_NOT_PRIME;
    }

    return pockle_insert(pockle, p, NULL, 0, NULL);
}